

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addConstraint
          (OptimalControlProblem *this,
          shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *newConstraint)

{
  element_type *this_00;
  ConstraintsGroup *this_01;
  bool bVar1;
  string *__args;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> dummyGroup;
  undefined1 local_71;
  ConstraintsGroup *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> local_60;
  shared_ptr<iDynTree::optimalcontrol::LinearConstraint> local_50;
  TimeRange local_40;
  
  this_00 = (newConstraint->
            super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (this_00 == (element_type *)0x0) {
    iDynTree::reportError("OptimalControlProblem","addConstraint","Invalid constraint pointer.");
    return false;
  }
  __args = Constraint::name_abi_cxx11_(&this_00->super_Constraint);
  local_40.m_initTime =
       (double)Constraint::constraintSize
                         (&((newConstraint->
                            super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_Constraint);
  local_70 = (ConstraintsGroup *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::ConstraintsGroup,std::allocator<iDynTree::optimalcontrol::ConstraintsGroup>,std::__cxx11::string_const&,unsigned_long>
            (&local_68,&local_70,(allocator<iDynTree::optimalcontrol::ConstraintsGroup> *)&local_71,
             __args,(unsigned_long *)&local_40);
  this_01 = local_70;
  if (local_70 == (ConstraintsGroup *)0x0) {
    iDynTree::reportError("OptimalControlProblem","addConstraint","Failed in adding constraint.");
  }
  else {
    local_50.
    super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (newConstraint->
             super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    local_50.
    super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (newConstraint->
         super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>)
         ._M_refcount._M_pi;
    if (local_50.
        super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.
         super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.
              super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.
         super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.
              super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    TimeRange::AnyTime();
    bVar1 = ConstraintsGroup::addConstraint(this_01,&local_50,&local_40);
    if (local_50.
        super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.
                 super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (bVar1) {
      local_60.
      super___shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_70;
      local_60.
      super___shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_68._M_pi;
      if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
        }
      }
      bVar1 = addGroupOfConstraints(this,&local_60);
      if (local_60.
          super___shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.
                   super___shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      goto LAB_00143077;
    }
  }
  bVar1 = false;
LAB_00143077:
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::addConstraint(std::shared_ptr<LinearConstraint> newConstraint)
        {
            if (!newConstraint){
                reportError("OptimalControlProblem", "addConstraint", "Invalid constraint pointer.");
                return false;
            }

            std::shared_ptr<ConstraintsGroup> dummyGroup =
                    std::make_shared<ConstraintsGroup>(newConstraint->name(),newConstraint->constraintSize());

            if(!dummyGroup){
                reportError("OptimalControlProblem", "addConstraint", "Failed in adding constraint.");
                return false;
            }

            if(!(dummyGroup->addConstraint(newConstraint, TimeRange::AnyTime()))){ //here is important to pass a LinearConstraint pointer
                return false;
            }
            return addGroupOfConstraints(dummyGroup);
        }